

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O1

int build_dd(DdManager *table,int num,int lower,int upper)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int x;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int index;
  int local_34;
  
  if ((computed == (st__table *)0x0) ||
     (iVar3 = st__lookup_int(computed,(char *)(storedd + (long)num * ((long)numvars + 1)),&local_34)
     , iVar3 == 0)) {
    uVar5 = (ulong)numvars;
    if (0 < (long)uVar5) {
      iVar3 = storedd[uVar5];
      iVar8 = 0;
      do {
        iVar7 = table->perm[storedd[((int)uVar5 + 1) * num + iVar8]];
        while (x = cuddNextLow(table,iVar7), lower + iVar8 <= x) {
          iVar4 = cuddSwapInPlace(table,x,iVar7);
          iVar7 = x;
          if (iVar4 == 0) {
            return 0;
          }
        }
        if (iVar3 * 0x14 < (int)(table->keys - table->isolated)) break;
        iVar8 = iVar8 + 1;
        uVar5 = (ulong)(uint)numvars;
      } while (iVar8 < numvars);
    }
    iVar8 = cuddSifting(table,lower,upper);
    piVar2 = storedd;
    iVar3 = numvars;
    if (iVar8 == 0) {
      return 0;
    }
    lVar6 = (long)numvars;
    if (0 < lVar6) {
      iVar8 = numvars + 1;
      piVar1 = table->invperm;
      lVar9 = 0;
      do {
        piVar2[iVar8 * num + lVar9] = piVar1[lower + lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
    }
    iVar8 = table->keys - table->isolated;
    iVar7 = iVar3 + 1;
  }
  else {
    iVar7 = numvars + 1;
    iVar8 = storedd[local_34 * iVar7 + numvars];
    iVar3 = numvars;
  }
  storedd[iVar7 * num + iVar3] = iVar8;
  return 1;
}

Assistant:

static int
build_dd(
  DdManager * table,
  int  num /* the index of the individual to be built */,
  int  lower,
  int  upper)
{
    int         i,j;            /* loop vars */
    int         position;
    int         index;
    int         limit;          /* how large the DD for this order can grow */
    int         size;

    /* Check the computed table. If the order already exists, it
    ** suffices to copy the size from the existing entry.
    */
    if (computed && st__lookup_int(computed,(char *)&STOREDD(num,0),&index)) {
        STOREDD(num,numvars) = STOREDD(index,numvars);
#ifdef DD_STATS
        (void) fprintf(table->out,"\nCache hit for index %d", index);
#endif
        return(1);
    }

    /* Stop if the DD grows 20 times larges than the reference size. */
    limit = 20 * STOREDD(0,numvars);

    /* Sift up the variables so as to build the desired permutation.
    ** First the variable that has to be on top is sifted to the top.
    ** Then the variable that has to occupy the secon position is sifted
    ** up to the second position, and so on.
    */
    for (j = 0; j < numvars; j++) {
        i = STOREDD(num,j);
        position = table->perm[i];
        result = sift_up(table,position,j+lower);
        if (!result) return(0);
        size = table->keys - table->isolated;
        if (size > limit) break;
    }

    /* Sift the DD just built. */
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    result = cuddSifting(table,lower,upper);
    if (!result) return(0);

    /* Copy order and size to table. */
    for (j = 0; j < numvars; j++) {
        STOREDD(num,j) = table->invperm[lower+j];
    }
    STOREDD(num,numvars) = table->keys - table->isolated; /* size of new DD */
    return(1);

}